

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

int __thiscall CVmDynamicFunc::get_invoker(CVmDynamicFunc *this,vm_val_t *val)

{
  char *ptr;
  vm_val_t *in_RSI;
  CVmDynamicFunc *in_RDI;
  
  if (in_RSI != (vm_val_t *)0x0) {
    get_ext(in_RDI);
    ptr = vm_dynfunc_ext::get_bytecode_ptr((vm_dynfunc_ext *)0x32ea5c);
    vm_val_t::set_codeptr(in_RSI,ptr);
  }
  return 1;
}

Assistant:

int CVmDynamicFunc::get_invoker(VMG_ vm_val_t *val)
{
    /* 
     *   Return a pointer to the start of our byte code.  The actual method
     *   header starts after our prefix.  
     */
    if (val != 0)
        val->set_codeptr(get_ext()->get_bytecode_ptr());

    /* we're invokable */
    return TRUE;
}